

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O0

utf_error utf8::internal::
          get_sequence_2<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *it,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         end,uint32_t *code_point)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  reference pcVar4;
  utf_error ret;
  uint32_t *code_point_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *it_local;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_local;
  
  it_local = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)end._M_current;
  bVar2 = __gnu_cxx::operator==
                    (it,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&it_local);
  if (bVar2) {
    end_local._M_current._4_4_ = NOT_ENOUGH_ROOM;
  }
  else {
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(it);
    bVar3 = mask8<char>(*pcVar4);
    *code_point = (uint)bVar3;
    end_local._M_current._4_4_ =
         increase_safely<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                   (it,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )it_local);
    if (end_local._M_current._4_4_ == UTF8_OK) {
      uVar1 = *code_point;
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(it);
      *code_point = (uVar1 & 0x1f) * 0x40 + ((int)*pcVar4 & 0x3fU);
      end_local._M_current._4_4_ = UTF8_OK;
    }
  }
  return end_local._M_current._4_4_;
}

Assistant:

utf_error get_sequence_2(octet_iterator& it, octet_iterator end, uint32_t& code_point)
      {
      if (it == end)
        return NOT_ENOUGH_ROOM;

      code_point = utf8::internal::mask8(*it);

      UTF8_CPP_INCREASE_AND_RETURN_ON_ERROR(it, end)

        code_point = ((code_point << 6) & 0x7ff) + ((*it) & 0x3f);

      return UTF8_OK;
      }